

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O0

int mustach(char *template,mustach_itf *itf,void *closure,char **result,size_t *size)

{
  FILE *file_00;
  long in_FS_OFFSET;
  FILE *file;
  char **ppcStack_40;
  int rc;
  size_t *size_local;
  char **result_local;
  void *closure_local;
  mustach_itf *itf_local;
  char *template_local;
  size_t s;
  
  s = *(size_t *)(in_FS_OFFSET + 0x28);
  *result = (char *)0x0;
  ppcStack_40 = (char **)size;
  if (size == (size_t *)0x0) {
    ppcStack_40 = &template_local;
  }
  file_00 = memfile_open(result,(size_t *)ppcStack_40);
  if (file_00 == (FILE *)0x0) {
    file._4_4_ = -1;
  }
  else {
    file._4_4_ = fmustach(template,itf,closure,file_00);
    if (file._4_4_ < 0) {
      memfile_abort(file_00,result,(size_t *)ppcStack_40);
    }
    else {
      file._4_4_ = memfile_close(file_00,result,(size_t *)ppcStack_40);
    }
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != s) {
    __stack_chk_fail();
  }
  return file._4_4_;
}

Assistant:

int mustach(const char *template, struct mustach_itf *itf, void *closure, char **result, size_t *size)
{
	int rc;
	FILE *file;
	size_t s;

	*result = NULL;
	if (size == NULL)
		size = &s;
	file = memfile_open(result, size);
	if (file == NULL)
		rc = MUSTACH_ERROR_SYSTEM;
	else {
		rc = fmustach(template, itf, closure, file);
		if (rc < 0)
			memfile_abort(file, result, size);
		else
			rc = memfile_close(file, result, size);
	}
	return rc;
}